

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int parse_file(archive_read *a,archive_entry *entry,mtree *mtree,mtree_entry *mentry,int *use_next)

{
  size_t sVar1;
  archive_entry *paVar2;
  mode_t mVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  la_int64_t lVar7;
  size_t n;
  int local_f0;
  int parsed_kws;
  int r1;
  int r;
  archive_entry *sparse_entry;
  mtree_entry *mp;
  stat *st;
  stat st_storage;
  char *path;
  int *use_next_local;
  mtree_entry *mentry_local;
  mtree *mtree_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  parsed_kws = 0;
  mentry->used = '\x01';
  mtree_local = (mtree *)entry;
  entry_local = (archive_entry *)a;
  archive_entry_set_filetype(entry,0x8000);
  archive_entry_set_size((archive_entry *)mtree_local,0);
  (mtree->contents_name).length = 0;
  n._4_4_ = 0;
  parsed_kws = parse_line((archive_read *)entry_local,(archive_entry *)mtree_local,mtree,mentry,
                          (int *)((long)&n + 4));
  if (mentry->full == '\0') {
    sVar1 = (mtree->current_dir).length;
    if (sVar1 != 0) {
      archive_strcat(&mtree->current_dir,"/");
    }
    archive_strcat(&mtree->current_dir,mentry->name);
    archive_entry_copy_pathname((archive_entry *)mtree_local,(mtree->current_dir).s);
    mVar3 = archive_entry_filetype((archive_entry *)mtree_local);
    if (mVar3 != 0x4000) {
      (mtree->current_dir).length = sVar1;
    }
  }
  else {
    archive_entry_copy_pathname((archive_entry *)mtree_local,mentry->name);
    for (sparse_entry = (archive_entry *)__archive_rb_tree_find_node(&mtree->rbtree,mentry->name);
        sparse_entry != (archive_entry *)0x0;
        sparse_entry = (archive_entry *)(sparse_entry->ae_stat).aest_atime) {
      if (((char)(sparse_entry->ae_stat).aest_mtime != '\0') &&
         (*(char *)((long)&(sparse_entry->ae_stat).aest_mtime + 1) == '\0')) {
        *(undefined1 *)((long)&(sparse_entry->ae_stat).aest_mtime + 1) = 1;
        local_f0 = parse_line((archive_read *)entry_local,(archive_entry *)mtree_local,mtree,
                              (mtree_entry *)sparse_entry,(int *)((long)&n + 4));
        if (local_f0 < parsed_kws) {
          parsed_kws = local_f0;
        }
      }
    }
  }
  if (mtree->checkfs != '\0') {
    mtree->fd = -1;
    if ((mtree->contents_name).length == 0) {
      st_storage.__glibc_reserved[2] =
           (__syscall_slong_t)archive_entry_pathname((archive_entry *)mtree_local);
    }
    else {
      st_storage.__glibc_reserved[2] = (__syscall_slong_t)(mtree->contents_name).s;
    }
    mVar3 = archive_entry_filetype((archive_entry *)mtree_local);
    if ((mVar3 == 0x8000) ||
       (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 == 0x4000)) {
      iVar4 = open((char *)st_storage.__glibc_reserved[2],0x80000);
      mtree->fd = iVar4;
      __archive_ensure_cloexec_flag(mtree->fd);
      if ((mtree->fd == -1) &&
         ((piVar5 = __errno_location(), paVar2 = entry_local, *piVar5 != 2 ||
          ((mtree->contents_name).length != 0)))) {
        piVar5 = __errno_location();
        archive_set_error((archive *)paVar2,*piVar5,"Can\'t open %s",st_storage.__glibc_reserved[2])
        ;
        parsed_kws = -0x14;
      }
    }
    mp = (mtree_entry *)&st;
    if (mtree->fd < 0) {
      iVar4 = lstat((char *)st_storage.__glibc_reserved[2],(stat *)mp);
      if (iVar4 == -1) {
        mp = (mtree_entry *)0x0;
      }
    }
    else {
      iVar4 = fstat(mtree->fd,(stat *)mp);
      paVar2 = entry_local;
      if (iVar4 == -1) {
        piVar5 = __errno_location();
        archive_set_error((archive *)paVar2,*piVar5,"Could not fstat %s",
                          st_storage.__glibc_reserved[2]);
        parsed_kws = -0x14;
        close(mtree->fd);
        mtree->fd = -1;
        mp = (mtree_entry *)0x0;
      }
    }
    if ((((((mp != (mtree_entry *)0x0) &&
           ((((ulong)mp->next_dup & 0xf000) != 0x8000 ||
            (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 != 0x8000)))) &&
          ((((ulong)mp->next_dup & 0xf000) != 0xa000 ||
           (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 != 0xa000)))) &&
         ((((((ulong)mp->next_dup & 0xc000) != 0xc000 ||
            (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 != 0xc000)) &&
           ((((ulong)mp->next_dup & 0xf000) != 0x2000 ||
            (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 != 0x2000)))) &&
          ((((ulong)mp->next_dup & 0xf000) != 0x6000 ||
           (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 != 0x6000)))))) &&
        ((((ulong)mp->next_dup & 0xf000) != 0x4000 ||
         (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 != 0x4000)))) &&
       ((((ulong)mp->next_dup & 0xf000) != 0x1000 ||
        (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 != 0x1000)))) {
      if (-1 < mtree->fd) {
        close(mtree->fd);
      }
      paVar2 = entry_local;
      mtree->fd = -1;
      if ((n._4_4_ & 0x800) == 0) {
        if (parsed_kws == 0) {
          pcVar6 = archive_entry_pathname((archive_entry *)mtree_local);
          archive_set_error((archive *)paVar2,-1,"mtree specification has different type for %s",
                            pcVar6);
          parsed_kws = -0x14;
        }
      }
      else {
        *use_next = 1;
      }
      return parsed_kws;
    }
    if (mp == (mtree_entry *)0x0) {
      if ((n._4_4_ & 0x800) != 0) {
        *use_next = 1;
        return 0;
      }
    }
    else {
      if ((((n._4_4_ & 1) == 0) || ((n._4_4_ & 0x1000) != 0)) &&
         ((mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 == 0x2000 ||
          (mVar3 = archive_entry_filetype((archive_entry *)mtree_local), mVar3 == 0x6000)))) {
        archive_entry_set_rdev((archive_entry *)mtree_local,(dev_t)mp->options);
      }
      if (((n._4_4_ & 0xc) == 0) || ((n._4_4_ & 0x1000) != 0)) {
        archive_entry_set_gid((archive_entry *)mtree_local,(ulong)*(uint *)&mp->next);
      }
      if (((n._4_4_ & 0x600) == 0) || ((n._4_4_ & 0x1000) != 0)) {
        archive_entry_set_uid
                  ((archive_entry *)mtree_local,(ulong)*(uint *)((long)&mp->next_dup + 4));
      }
      if (((n._4_4_ & 0x10) == 0) || ((n._4_4_ & 0x1000) != 0)) {
        archive_entry_set_mtime
                  ((archive_entry *)mtree_local,(time_t)mp[1].next_dup,(long)mp[1].next);
      }
      if (((n._4_4_ & 0x20) == 0) || ((n._4_4_ & 0x1000) != 0)) {
        archive_entry_set_nlink((archive_entry *)mtree_local,(uint)(mp->rbnode).rb_info);
      }
      if (((n._4_4_ & 0x40) == 0) || ((n._4_4_ & 0x1000) != 0)) {
        archive_entry_set_perm((archive_entry *)mtree_local,*(mode_t *)&mp->next_dup);
      }
      if (((n._4_4_ & 0x80) == 0) || ((n._4_4_ & 0x1000) != 0)) {
        archive_entry_set_size((archive_entry *)mtree_local,(la_int64_t)mp->name);
      }
      archive_entry_set_ino((archive_entry *)mtree_local,(la_int64_t)(mp->rbnode).rb_nodes[1]);
      archive_entry_set_dev((archive_entry *)mtree_local,(dev_t)(mp->rbnode).rb_nodes[0]);
      archive_entry_linkify(mtree->resolver,(archive_entry **)&mtree_local,(archive_entry **)&r1);
    }
  }
  lVar7 = archive_entry_size((archive_entry *)mtree_local);
  mtree->cur_size = lVar7;
  mtree->offset = 0;
  return parsed_kws;
}

Assistant:

static int
parse_file(struct archive_read *a, struct archive_entry *entry,
    struct mtree *mtree, struct mtree_entry *mentry, int *use_next)
{
	const char *path;
	struct stat st_storage, *st;
	struct mtree_entry *mp;
	struct archive_entry *sparse_entry;
	int r = ARCHIVE_OK, r1, parsed_kws;

	mentry->used = 1;

	/* Initialize reasonable defaults. */
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	archive_string_empty(&mtree->contents_name);

	/* Parse options from this line. */
	parsed_kws = 0;
	r = parse_line(a, entry, mtree, mentry, &parsed_kws);

	if (mentry->full) {
		archive_entry_copy_pathname(entry, mentry->name);
		/*
		 * "Full" entries are allowed to have multiple lines
		 * and those lines aren't required to be adjacent.  We
		 * don't support multiple lines for "relative" entries
		 * nor do we make any attempt to merge data from
		 * separate "relative" and "full" entries.  (Merging
		 * "relative" and "full" entries would require dealing
		 * with pathname canonicalization, which is a very
		 * tricky subject.)
		 */
		mp = (struct mtree_entry *)__archive_rb_tree_find_node(
		    &mtree->rbtree, mentry->name);
		for (; mp; mp = mp->next_dup) {
			if (mp->full && !mp->used) {
				/* Later lines override earlier ones. */
				mp->used = 1;
				r1 = parse_line(a, entry, mtree, mp, &parsed_kws);
				if (r1 < r)
					r = r1;
			}
		}
	} else {
		/*
		 * Relative entries require us to construct
		 * the full path and possibly update the
		 * current directory.
		 */
		size_t n = archive_strlen(&mtree->current_dir);
		if (n > 0)
			archive_strcat(&mtree->current_dir, "/");
		archive_strcat(&mtree->current_dir, mentry->name);
		archive_entry_copy_pathname(entry, mtree->current_dir.s);
		if (archive_entry_filetype(entry) != AE_IFDIR)
			mtree->current_dir.length = n;
	}

	if (mtree->checkfs) {
		/*
		 * Try to open and stat the file to get the real size
		 * and other file info.  It would be nice to avoid
		 * this here so that getting a listing of an mtree
		 * wouldn't require opening every referenced contents
		 * file.  But then we wouldn't know the actual
		 * contents size, so I don't see a really viable way
		 * around this.  (Also, we may want to someday pull
		 * other unspecified info from the contents file on
		 * disk.)
		 */
		mtree->fd = -1;
		if (archive_strlen(&mtree->contents_name) > 0)
			path = mtree->contents_name.s;
		else
			path = archive_entry_pathname(entry);

		if (archive_entry_filetype(entry) == AE_IFREG ||
				archive_entry_filetype(entry) == AE_IFDIR) {
			mtree->fd = open(path, O_RDONLY | O_BINARY | O_CLOEXEC);
			__archive_ensure_cloexec_flag(mtree->fd);
			if (mtree->fd == -1 &&
				(errno != ENOENT ||
				 archive_strlen(&mtree->contents_name) > 0)) {
				archive_set_error(&a->archive, errno,
						"Can't open %s", path);
				r = ARCHIVE_WARN;
			}
		}

		st = &st_storage;
		if (mtree->fd >= 0) {
			if (fstat(mtree->fd, st) == -1) {
				archive_set_error(&a->archive, errno,
						"Could not fstat %s", path);
				r = ARCHIVE_WARN;
				/* If we can't stat it, don't keep it open. */
				close(mtree->fd);
				mtree->fd = -1;
				st = NULL;
			}
		} else if (lstat(path, st) == -1) {
			st = NULL;
		}

		/*
		 * Check for a mismatch between the type in the specification
		 * and the type of the contents object on disk.
		 */
		if (st != NULL) {
			if (((st->st_mode & S_IFMT) == S_IFREG &&
			      archive_entry_filetype(entry) == AE_IFREG)
#ifdef S_IFLNK
			  ||((st->st_mode & S_IFMT) == S_IFLNK &&
			      archive_entry_filetype(entry) == AE_IFLNK)
#endif
#ifdef S_IFSOCK
			  ||((st->st_mode & S_IFSOCK) == S_IFSOCK &&
			      archive_entry_filetype(entry) == AE_IFSOCK)
#endif
#ifdef S_IFCHR
			  ||((st->st_mode & S_IFMT) == S_IFCHR &&
			      archive_entry_filetype(entry) == AE_IFCHR)
#endif
#ifdef S_IFBLK
			  ||((st->st_mode & S_IFMT) == S_IFBLK &&
			      archive_entry_filetype(entry) == AE_IFBLK)
#endif
			  ||((st->st_mode & S_IFMT) == S_IFDIR &&
			      archive_entry_filetype(entry) == AE_IFDIR)
#ifdef S_IFIFO
			  ||((st->st_mode & S_IFMT) == S_IFIFO &&
			      archive_entry_filetype(entry) == AE_IFIFO)
#endif
			) {
				/* Types match. */
			} else {
				/* Types don't match; bail out gracefully. */
				if (mtree->fd >= 0)
					close(mtree->fd);
				mtree->fd = -1;
				if (parsed_kws & MTREE_HAS_OPTIONAL) {
					/* It's not an error for an optional
					 * entry to not match disk. */
					*use_next = 1;
				} else if (r == ARCHIVE_OK) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "mtree specification has different"
					    " type for %s",
					    archive_entry_pathname(entry));
					r = ARCHIVE_WARN;
				}
				return (r);
			}
		}

		/*
		 * If there is a contents file on disk, pick some of the
		 * metadata from that file.  For most of these, we only
		 * set it from the contents if it wasn't already parsed
		 * from the specification.
		 */
		if (st != NULL) {
			if (((parsed_kws & MTREE_HAS_DEVICE) == 0 ||
				(parsed_kws & MTREE_HAS_NOCHANGE) != 0) &&
				(archive_entry_filetype(entry) == AE_IFCHR ||
				 archive_entry_filetype(entry) == AE_IFBLK))
				archive_entry_set_rdev(entry, st->st_rdev);
			if ((parsed_kws & (MTREE_HAS_GID | MTREE_HAS_GNAME))
				== 0 ||
			    (parsed_kws & MTREE_HAS_NOCHANGE) != 0)
				archive_entry_set_gid(entry, st->st_gid);
			if ((parsed_kws & (MTREE_HAS_UID | MTREE_HAS_UNAME))
				== 0 ||
			    (parsed_kws & MTREE_HAS_NOCHANGE) != 0)
				archive_entry_set_uid(entry, st->st_uid);
			if ((parsed_kws & MTREE_HAS_MTIME) == 0 ||
			    (parsed_kws & MTREE_HAS_NOCHANGE) != 0) {
#if HAVE_STRUCT_STAT_ST_MTIMESPEC_TV_NSEC
				archive_entry_set_mtime(entry, st->st_mtime,
						st->st_mtimespec.tv_nsec);
#elif HAVE_STRUCT_STAT_ST_MTIM_TV_NSEC
				archive_entry_set_mtime(entry, st->st_mtime,
						st->st_mtim.tv_nsec);
#elif HAVE_STRUCT_STAT_ST_MTIME_N
				archive_entry_set_mtime(entry, st->st_mtime,
						st->st_mtime_n);
#elif HAVE_STRUCT_STAT_ST_UMTIME
				archive_entry_set_mtime(entry, st->st_mtime,
						st->st_umtime*1000);
#elif HAVE_STRUCT_STAT_ST_MTIME_USEC
				archive_entry_set_mtime(entry, st->st_mtime,
						st->st_mtime_usec*1000);
#else
				archive_entry_set_mtime(entry, st->st_mtime, 0);
#endif
			}
			if ((parsed_kws & MTREE_HAS_NLINK) == 0 ||
			    (parsed_kws & MTREE_HAS_NOCHANGE) != 0)
				archive_entry_set_nlink(entry, st->st_nlink);
			if ((parsed_kws & MTREE_HAS_PERM) == 0 ||
			    (parsed_kws & MTREE_HAS_NOCHANGE) != 0)
				archive_entry_set_perm(entry, st->st_mode);
			if ((parsed_kws & MTREE_HAS_SIZE) == 0 ||
			    (parsed_kws & MTREE_HAS_NOCHANGE) != 0)
				archive_entry_set_size(entry, st->st_size);
			archive_entry_set_ino(entry, st->st_ino);
			archive_entry_set_dev(entry, st->st_dev);

			archive_entry_linkify(mtree->resolver, &entry,
				&sparse_entry);
		} else if (parsed_kws & MTREE_HAS_OPTIONAL) {
			/*
			 * Couldn't open the entry, stat it or the on-disk type
			 * didn't match.  If this entry is optional, just
			 * ignore it and read the next header entry.
			 */
			*use_next = 1;
			return ARCHIVE_OK;
		}
	}

	mtree->cur_size = archive_entry_size(entry);
	mtree->offset = 0;

	return r;
}